

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNBu12.cpp
# Opt level: O3

void __thiscall NaPNBus1i2o::relate_connectors(NaPNBus1i2o *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  NaVector *pNVar5;
  NaVector *pNVar6;
  undefined8 extraout_RDX;
  NaPetriCnOutput *this_00;
  
  iVar2 = this->nOutDimProp1;
  if (iVar2 == 0) {
    pNVar5 = NaPetriCnInput::data(&this->in);
    iVar2 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    uVar4 = iVar2 - this->nOutDimProp2;
    uVar1 = 0;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    pNVar5 = NaPetriCnOutput::data(&this->out1);
    (*pNVar5->_vptr_NaVector[4])(pNVar5,(ulong)uVar1);
    this_00 = &this->out2;
  }
  else {
    iVar3 = this->nOutDimProp2;
    if (iVar3 != 0) {
      pNVar5 = NaPetriCnOutput::data(&this->out2);
      pNVar6 = NaPetriCnInput::data(&this->in);
      uVar1 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
      (*pNVar5->_vptr_NaVector[4])
                (pNVar5,(long)((double)uVar1 * ((double)iVar3 / (double)(iVar2 + iVar3))));
      pNVar5 = NaPetriCnOutput::data(&this->out1);
      pNVar6 = NaPetriCnInput::data(&this->in);
      iVar2 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
      pNVar6 = NaPetriCnOutput::data(&this->out2);
      iVar3 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
      (*pNVar5->_vptr_NaVector[4])(pNVar5,(ulong)(uint)(iVar2 - iVar3));
      return;
    }
    pNVar5 = NaPetriCnInput::data(&this->in);
    iVar2 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    uVar4 = iVar2 - this->nOutDimProp1;
    uVar1 = 0;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    pNVar5 = NaPetriCnOutput::data(&this->out2);
    (*pNVar5->_vptr_NaVector[4])(pNVar5,(ulong)uVar1);
    this_00 = &this->out1;
  }
  pNVar5 = NaPetriCnOutput::data(this_00);
  pNVar6 = NaPetriCnInput::data(&this->in);
  iVar2 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
  (*pNVar5->_vptr_NaVector[4])(pNVar5,(ulong)(iVar2 - uVar1),extraout_RDX,pNVar5->_vptr_NaVector[4])
  ;
  return;
}

Assistant:

void
NaPNBus1i2o::relate_connectors ()
{
    if(0 == nOutDimProp1) {
	int nOut1 = in.data().dim() - nOutDimProp2;
	if(nOut1 < 0)
	    nOut1 = 0;
	out1.data().new_dim(nOut1);
	out2.data().new_dim(in.data().dim() - nOut1);
    }
    else if(0 == nOutDimProp2) {
	int nOut2 = in.data().dim() - nOutDimProp1;
	if(nOut2 < 0)
	    nOut2 = 0;
	out2.data().new_dim(nOut2);
	out1.data().new_dim(in.data().dim() - nOut2);
    }
    else {
	double fRatio2 = (double)nOutDimProp2 / (nOutDimProp1 + nOutDimProp2);

	out2.data().new_dim(fRatio2 * in.data().dim());
	out1.data().new_dim(in.data().dim() - out2.data().dim());
    }
}